

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFNumberTreeObjectHelper.cc
# Opt level: O3

void __thiscall
QPDFNumberTreeObjectHelper::iterator::iterator(iterator *this,shared_ptr<NNTreeIterator> *i)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  this->_vptr_iterator = (_func_int **)&PTR__iterator_002ed8f8;
  (this->impl).super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (i->super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (i->super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (this->impl).super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (this->ivalue).first = 0;
  (this->ivalue).second.super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->ivalue).second.super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  return;
}

Assistant:

QPDFNumberTreeObjectHelper::iterator::iterator(std::shared_ptr<NNTreeIterator> const& i) :
    impl(i)
{
}